

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_visit_parents(ggml_cgraph *cgraph,ggml_tensor *node)

{
  int iVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined8 uVar11;
  ulong uVar12;
  long lVar13;
  ggml_type *extraout_RDX;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  ggml_tensor *node_00;
  ulong uVar17;
  ggml_cgraph *pgVar18;
  int iVar19;
  size_t sVar20;
  ulong uVar21;
  size_t sVar22;
  ushort *puVar23;
  long lVar24;
  long lVar25;
  undefined4 *puVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  undefined2 *puVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  long lStack_88;
  ulong uStack_70;
  
  uVar12 = (ulong)cgraph->n_nodes;
  bVar31 = 0 < (long)uVar12;
  if (0 < (long)uVar12) {
    if (cgraph->nodes[0] != node) {
      uVar17 = 0;
      do {
        if (uVar12 - 1 == uVar17) goto LAB_001323c1;
        uVar14 = uVar17 + 1;
        lVar28 = uVar17 + 1;
        uVar17 = uVar14;
      } while (cgraph->nodes[lVar28] != node);
      bVar31 = uVar14 < uVar12;
    }
    if (bVar31) {
      return;
    }
  }
LAB_001323c1:
  uVar12 = (ulong)cgraph->n_leafs;
  bVar31 = 0 < (long)uVar12;
  if (0 < (long)uVar12) {
    if (cgraph->leafs[0] != node) {
      uVar17 = 0;
      do {
        if (uVar12 - 1 == uVar17) goto LAB_001323fc;
        uVar14 = uVar17 + 1;
        lVar28 = uVar17 + 1;
        uVar17 = uVar14;
      } while (cgraph->leafs[lVar28] != node);
      bVar31 = uVar14 < uVar12;
    }
    if (bVar31) {
      return;
    }
  }
LAB_001323fc:
  pgVar18 = cgraph;
  if (node->src0 != (ggml_tensor *)0x0) {
    ggml_visit_parents(cgraph,node->src0);
  }
  if (node->src1 != (ggml_tensor *)0x0) {
    pgVar18 = cgraph;
    ggml_visit_parents(cgraph,node->src1);
  }
  lVar28 = 0xb;
  do {
    node_00 = *(ggml_tensor **)(node->ne + lVar28 * 2 + -2);
    if (node_00 != (ggml_tensor *)0x0) {
      pgVar18 = cgraph;
      ggml_visit_parents(cgraph,node_00);
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0xf);
  if ((node->op == GGML_OP_NONE) && (node->grad == (ggml_tensor *)0x0)) {
    iVar1 = cgraph->n_leafs;
    if ((long)iVar1 < 0x1000) {
      cgraph->leafs[iVar1] = node;
      cgraph->n_leafs = iVar1 + 1;
      return;
    }
  }
  else {
    iVar1 = cgraph->n_nodes;
    lVar28 = (long)iVar1;
    if (lVar28 < 0x1000) {
      cgraph->nodes[lVar28] = node;
      cgraph->grads[lVar28] = node->grad;
      cgraph->n_nodes = iVar1 + 1;
      return;
    }
    ggml_visit_parents_cold_1();
  }
  ggml_visit_parents_cold_2();
  gVar2 = node_00->type;
  uVar12 = (ulong)gVar2;
  switch(uVar12) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 7:
    ggml_compute_forward_dup_cold_1();
    goto LAB_00132d7a;
  case 5:
    if (pgVar18->n_leafs == 0) {
      gVar3 = *extraout_RDX;
      uVar17 = (ulong)gVar3;
      if (*(undefined8 *)(extraout_RDX + 6) != GGML_TYPE_SIZE[uVar17]) {
LAB_00132d7a:
        ggml_compute_forward_dup_cold_8();
        goto LAB_00132d7f;
      }
      if (*(undefined8 *)(extraout_RDX + 8) !=
          (ulong)(*(undefined8 *)(extraout_RDX + 6) * (long)(int)extraout_RDX[2]) /
          (ulong)(long)GGML_BLCK_SIZE[uVar17]) goto LAB_00132d7a;
      if ((*(undefined8 *)(extraout_RDX + 10) !=
           *(undefined8 *)(extraout_RDX + 8) * (long)(int)extraout_RDX[3]) ||
         (*(undefined8 *)(extraout_RDX + 0xc) !=
          *(undefined8 *)(extraout_RDX + 10) * (long)(int)extraout_RDX[4])) goto LAB_00132d7a;
      iVar19 = extraout_RDX[3] * extraout_RDX[2] * extraout_RDX[4] * extraout_RDX[5];
      uVar4 = node_00->ne[0];
      uVar5 = node_00->ne[1];
      iVar1 = node_00->ne[2];
      lVar28 = (long)iVar1;
      uVar6 = node_00->ne[3];
      uVar14 = (ulong)uVar6;
      if (iVar19 != uVar6 * iVar1 * uVar5 * uVar4) goto LAB_00132d8e;
      if ((pgVar18->n_nodes & 0xfffffffdU) == 0) {
        return;
      }
      sVar7 = node_00->nb[0];
      sVar8 = node_00->nb[1];
      sVar9 = node_00->nb[2];
      sVar10 = node_00->nb[3];
      sVar20 = GGML_TYPE_SIZE[uVar12];
      if ((((sVar7 == sVar20) &&
           (sVar8 == (sVar7 * (long)(int)uVar4) / (ulong)(long)GGML_BLCK_SIZE[uVar12])) &&
          (sVar9 == sVar8 * (long)(int)uVar5)) && ((gVar2 == gVar3 && (sVar10 == sVar9 * lVar28))))
      {
LAB_00132828:
        memcpy(*(void **)(extraout_RDX + 0x24),node_00->data,(long)iVar19 * sVar20);
        return;
      }
      uVar12 = (ulong)uVar4;
      uVar15 = (ulong)uVar5;
      if (sVar7 != 2) {
        if (uVar17 == 5) {
          if (0 < (int)uVar6) {
            uVar11 = *(undefined8 *)(extraout_RDX + 0x24);
            lVar25 = 0;
            uVar17 = 0;
            iVar19 = 0;
            do {
              if (0 < iVar1) {
                lVar24 = 0;
                lVar13 = lVar25;
                do {
                  if (0 < (int)uVar5) {
                    uVar21 = 0;
                    lVar29 = lVar13;
                    do {
                      if (0 < (int)uVar4) {
                        puVar30 = (undefined2 *)((long)node_00->data + lVar29);
                        uVar27 = 0;
                        do {
                          *(undefined2 *)(uVar11 + (long)iVar19 * 2 + uVar27 * 2) = *puVar30;
                          uVar27 = uVar27 + 1;
                          puVar30 = (undefined2 *)((long)puVar30 + sVar7);
                        } while (uVar12 != uVar27);
                        iVar19 = iVar19 + (int)uVar27;
                      }
                      uVar21 = uVar21 + 1;
                      lVar29 = lVar29 + sVar8;
                    } while (uVar21 != uVar15);
                  }
                  lVar24 = lVar24 + 1;
                  lVar13 = lVar13 + sVar9;
                } while (lVar24 != lVar28);
              }
              uVar17 = uVar17 + 1;
              lVar25 = lVar25 + sVar10;
            } while (uVar17 != uVar14);
            return;
          }
          return;
        }
        if (gVar3 == GGML_TYPE_F32) {
          if (0 < (int)uVar6) {
            uVar11 = *(undefined8 *)(extraout_RDX + 0x24);
            lVar25 = 0;
            uVar17 = 0;
            iVar19 = 0;
            do {
              if (0 < iVar1) {
                lVar24 = 0;
                lVar13 = lVar25;
                do {
                  if (0 < (int)uVar5) {
                    uVar21 = 0;
                    lVar29 = lVar13;
                    do {
                      if (0 < (int)uVar4) {
                        puVar23 = (ushort *)((long)node_00->data + lVar29);
                        uVar27 = 0;
                        do {
                          *(float *)(uVar11 + (long)iVar19 * 4 + uVar27 * 4) =
                               table_f32_f16[*puVar23];
                          uVar27 = uVar27 + 1;
                          puVar23 = (ushort *)((long)puVar23 + sVar7);
                        } while (uVar12 != uVar27);
                        iVar19 = iVar19 + (int)uVar27;
                      }
                      uVar21 = uVar21 + 1;
                      lVar29 = lVar29 + sVar8;
                    } while (uVar21 != uVar15);
                  }
                  lVar24 = lVar24 + 1;
                  lVar13 = lVar13 + sVar9;
                } while (lVar24 != lVar28);
              }
              uVar17 = uVar17 + 1;
              lVar25 = lVar25 + sVar10;
            } while (uVar17 != uVar14);
            return;
          }
          return;
        }
        goto LAB_00132da7;
      }
      if (uVar17 == 6) {
        if ((int)uVar6 < 1) {
          return;
        }
        uVar11 = *(undefined8 *)(extraout_RDX + 0x24);
        lVar25 = 0;
        uVar17 = 0;
        iVar19 = 0;
        do {
          if (0 < iVar1) {
            lVar24 = 0;
            lVar13 = lVar25;
            do {
              if (0 < (int)uVar5) {
                uVar21 = 0;
                lVar29 = lVar13;
                do {
                  if (0 < (int)uVar4) {
                    puVar23 = (ushort *)((long)node_00->data + lVar29);
                    uVar27 = 0;
                    do {
                      *(float *)(uVar11 + (long)iVar19 * 4 + uVar27 * 4) = table_f32_f16[*puVar23];
                      uVar27 = uVar27 + 1;
                      puVar23 = puVar23 + 1;
                    } while (uVar12 != uVar27);
                    iVar19 = iVar19 + (int)uVar27;
                  }
                  uVar21 = uVar21 + 1;
                  lVar29 = lVar29 + sVar8;
                } while (uVar21 != uVar15);
              }
              lVar24 = lVar24 + 1;
              lVar13 = lVar13 + sVar9;
            } while (lVar24 != lVar28);
          }
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + sVar10;
        } while (uVar17 != uVar14);
        return;
      }
      if (gVar3 == GGML_TYPE_F16) {
        if (0 < (int)uVar6) {
          sVar22 = (long)(int)uVar4 * 2;
          lStack_88 = 0;
          uStack_70 = 0;
          iVar19 = 0;
          do {
            if (0 < iVar1) {
              lVar13 = 0;
              lVar25 = lStack_88;
              do {
                if (0 < (int)uVar5) {
                  lVar29 = sVar22 * (long)iVar19;
                  iVar19 = iVar19 + uVar5;
                  uVar12 = uVar15;
                  lVar24 = lVar25;
                  do {
                    memcpy((void *)(*(undefined8 *)(extraout_RDX + 0x24) + lVar29),
                           (void *)((long)node_00->data + lVar24),sVar22);
                    lVar24 = lVar24 + sVar8;
                    lVar29 = lVar29 + sVar22;
                    uVar12 = uVar12 - 1;
                  } while (uVar12 != 0);
                }
                lVar13 = lVar13 + 1;
                lVar25 = lVar25 + sVar9;
              } while (lVar13 != lVar28);
            }
            uStack_70 = uStack_70 + 1;
            lStack_88 = lStack_88 + sVar10;
          } while (uStack_70 != uVar14);
          return;
        }
        return;
      }
    }
    else {
LAB_00132d84:
      ggml_compute_forward_dup_cold_7();
LAB_00132d89:
      ggml_compute_forward_dup_cold_2();
LAB_00132d8e:
      ggml_compute_forward_dup_cold_9();
LAB_00132d93:
      ggml_compute_forward_dup_cold_4();
    }
    ggml_compute_forward_dup_cold_11();
LAB_00132d9d:
    ggml_compute_forward_dup_cold_6();
    break;
  case 6:
    if (pgVar18->n_leafs != 0) goto LAB_00132d89;
    gVar3 = *extraout_RDX;
    uVar17 = (ulong)gVar3;
    if (*(undefined8 *)(extraout_RDX + 6) != GGML_TYPE_SIZE[uVar17]) {
LAB_00132d7f:
      ggml_compute_forward_dup_cold_3();
      goto LAB_00132d84;
    }
    if (*(undefined8 *)(extraout_RDX + 8) !=
        (ulong)(*(undefined8 *)(extraout_RDX + 6) * (long)(int)extraout_RDX[2]) /
        (ulong)(long)GGML_BLCK_SIZE[uVar17]) goto LAB_00132d7f;
    if ((*(undefined8 *)(extraout_RDX + 10) !=
         *(undefined8 *)(extraout_RDX + 8) * (long)(int)extraout_RDX[3]) ||
       (*(undefined8 *)(extraout_RDX + 0xc) !=
        *(undefined8 *)(extraout_RDX + 10) * (long)(int)extraout_RDX[4])) goto LAB_00132d7f;
    iVar19 = extraout_RDX[3] * extraout_RDX[2] * extraout_RDX[4] * extraout_RDX[5];
    uVar4 = node_00->ne[0];
    uVar5 = node_00->ne[1];
    iVar1 = node_00->ne[2];
    lVar28 = (long)iVar1;
    uVar6 = node_00->ne[3];
    uVar14 = (ulong)uVar6;
    if (iVar19 != uVar6 * iVar1 * uVar5 * uVar4) goto LAB_00132d93;
    if ((pgVar18->n_nodes & 0xfffffffdU) == 0) {
      return;
    }
    sVar7 = node_00->nb[0];
    sVar8 = node_00->nb[1];
    sVar9 = node_00->nb[2];
    sVar10 = node_00->nb[3];
    sVar20 = GGML_TYPE_SIZE[uVar12];
    if ((((sVar7 == sVar20) &&
         (sVar8 == (sVar7 * (long)(int)uVar4) / (ulong)(long)GGML_BLCK_SIZE[uVar12])) &&
        (sVar9 == sVar8 * (long)(int)uVar5)) && ((gVar2 == gVar3 && (sVar10 == sVar9 * lVar28))))
    goto LAB_00132828;
    uVar12 = (ulong)uVar4;
    uVar15 = (ulong)uVar5;
    if (sVar7 == 4) {
      if (uVar17 == 5) {
        if (0 < (int)uVar6) {
          lVar25 = 0;
          uVar17 = 0;
          do {
            if (0 < iVar1) {
              lVar24 = 0;
              lVar13 = lVar25;
              do {
                if (0 < (int)uVar5) {
                  uVar21 = 0;
                  lVar29 = lVar13;
                  do {
                    if (0 < (int)uVar4) {
                      puVar16 = (uint *)((long)node_00->data + lVar29);
                      uVar27 = 0;
                      do {
                        auVar32 = vcvtps2ph_f16c(ZEXT416(*puVar16),0);
                        vpextrw_avx(auVar32,0);
                        uVar27 = uVar27 + 1;
                        puVar16 = puVar16 + 1;
                      } while (uVar12 != uVar27);
                    }
                    uVar21 = uVar21 + 1;
                    lVar29 = lVar29 + sVar8;
                  } while (uVar21 != uVar15);
                }
                lVar24 = lVar24 + 1;
                lVar13 = lVar13 + sVar9;
              } while (lVar24 != lVar28);
            }
            uVar17 = uVar17 + 1;
            lVar25 = lVar25 + sVar10;
          } while (uVar17 != uVar14);
          return;
        }
        return;
      }
      if (gVar3 == GGML_TYPE_F32) {
        if (0 < (int)uVar6) {
          sVar22 = (long)(int)uVar4 * 4;
          lStack_88 = 0;
          uStack_70 = 0;
          iVar19 = 0;
          do {
            if (0 < iVar1) {
              lVar13 = 0;
              lVar25 = lStack_88;
              do {
                if (0 < (int)uVar5) {
                  lVar29 = sVar22 * (long)iVar19;
                  iVar19 = iVar19 + uVar5;
                  uVar12 = uVar15;
                  lVar24 = lVar25;
                  do {
                    memcpy((void *)(*(undefined8 *)(extraout_RDX + 0x24) + lVar29),
                           (void *)((long)node_00->data + lVar24),sVar22);
                    lVar24 = lVar24 + sVar8;
                    lVar29 = lVar29 + sVar22;
                    uVar12 = uVar12 - 1;
                  } while (uVar12 != 0);
                }
                lVar13 = lVar13 + 1;
                lVar25 = lVar25 + sVar9;
              } while (lVar13 != lVar28);
            }
            uStack_70 = uStack_70 + 1;
            lStack_88 = lStack_88 + sVar10;
          } while (uStack_70 != uVar14);
          return;
        }
        return;
      }
      goto LAB_00132d9d;
    }
    if (uVar17 == 5) {
      if (0 < (int)uVar6) {
        lVar25 = 0;
        uVar17 = 0;
        do {
          if (0 < iVar1) {
            lVar24 = 0;
            lVar13 = lVar25;
            do {
              if (0 < (int)uVar5) {
                uVar21 = 0;
                lVar29 = lVar13;
                do {
                  if (0 < (int)uVar4) {
                    puVar16 = (uint *)((long)node_00->data + lVar29);
                    uVar27 = 0;
                    do {
                      auVar32 = vcvtps2ph_f16c(ZEXT416(*puVar16),0);
                      vpextrw_avx(auVar32,0);
                      uVar27 = uVar27 + 1;
                      puVar16 = (uint *)((long)puVar16 + sVar7);
                    } while (uVar12 != uVar27);
                  }
                  uVar21 = uVar21 + 1;
                  lVar29 = lVar29 + sVar8;
                } while (uVar21 != uVar15);
              }
              lVar24 = lVar24 + 1;
              lVar13 = lVar13 + sVar9;
            } while (lVar24 != lVar28);
          }
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + sVar10;
        } while (uVar17 != uVar14);
        return;
      }
      return;
    }
    if (gVar3 == GGML_TYPE_F32) {
      if (0 < (int)uVar6) {
        uVar11 = *(undefined8 *)(extraout_RDX + 0x24);
        lVar25 = 0;
        uVar17 = 0;
        iVar19 = 0;
        do {
          if (0 < iVar1) {
            lVar24 = 0;
            lVar13 = lVar25;
            do {
              if (0 < (int)uVar5) {
                uVar21 = 0;
                lVar29 = lVar13;
                do {
                  if (0 < (int)uVar4) {
                    puVar26 = (undefined4 *)((long)node_00->data + lVar29);
                    uVar27 = 0;
                    do {
                      *(undefined4 *)(uVar11 + (long)iVar19 * 4 + uVar27 * 4) = *puVar26;
                      uVar27 = uVar27 + 1;
                      puVar26 = (undefined4 *)((long)puVar26 + sVar7);
                    } while (uVar12 != uVar27);
                    iVar19 = iVar19 + (int)uVar27;
                  }
                  uVar21 = uVar21 + 1;
                  lVar29 = lVar29 + sVar8;
                } while (uVar21 != uVar15);
              }
              lVar24 = lVar24 + 1;
              lVar13 = lVar13 + sVar9;
            } while (lVar24 != lVar28);
          }
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + sVar10;
        } while (uVar17 != uVar14);
        return;
      }
      return;
    }
    break;
  default:
    return;
  }
  ggml_compute_forward_dup_cold_5();
LAB_00132da7:
  ggml_compute_forward_dup_cold_10();
}

Assistant:

static void ggml_visit_parents(struct ggml_cgraph * cgraph, struct ggml_tensor * node) {
    if (node->grad == NULL) {
        // this usually happens when we generate intermediate nodes from constants in the backward pass
        // it can also happen during forward pass, if the user performs computations with constants
        if (node->op != GGML_OP_NONE) {
            //GGML_PRINT_DEBUG("%s: warning: node %p has no grad, but op %d\n", __func__, (void *) node, node->op);
        }
    }

    // check if already visited
    for (int i = 0; i < cgraph->n_nodes; i++) {
        if (cgraph->nodes[i] == node) {
            return;
        }
    }

    for (int i = 0; i < cgraph->n_leafs; i++) {
        if (cgraph->leafs[i] == node) {
            return;
        }
    }

    if (node->src0) {
        ggml_visit_parents(cgraph, node->src0);
    }

    if (node->src1) {
        ggml_visit_parents(cgraph, node->src1);
    }

    for (int i = 0; i < GGML_MAX_OPT; ++i) {
        if (node->opt[i]) {
            ggml_visit_parents(cgraph, node->opt[i]);
        }
    }

    if (node->op == GGML_OP_NONE && node->grad == NULL) {
        // reached a leaf node, not part of the gradient graph (e.g. a constant)
        GGML_ASSERT(cgraph->n_leafs < GGML_MAX_NODES);

        cgraph->leafs[cgraph->n_leafs] = node;
        cgraph->n_leafs++;
    } else {
        GGML_ASSERT(cgraph->n_nodes < GGML_MAX_NODES);

        cgraph->nodes[cgraph->n_nodes] = node;
        cgraph->grads[cgraph->n_nodes] = node->grad;
        cgraph->n_nodes++;
    }
}